

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.hpp
# Opt level: O2

vector_type *
nanoNet::Trainer::biasGradientFromValues
          (vector_type *__return_storage_ptr__,NeuralNetworkLayer *layer,vector_type *values,
          vector_type *gradients)

{
  size_t i;
  ulong uVar1;
  float fVar2;
  allocator_type local_39;
  float local_38;
  value_type_conflict local_34;
  
  local_34 = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,layer->m_outputCount,&local_34,&local_39);
  for (uVar1 = 0; uVar1 < layer->m_outputCount; uVar1 = uVar1 + 1) {
    local_38 = (gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar1];
    fVar2 = ActivationFunction::operator[]
                      (&layer->m_activationFunction,
                       (values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar1]);
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1] = local_38 * fVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector_type biasGradientFromValues(const NeuralNetworkLayer& layer,
        const vector_type& values, const vector_type& gradients)
    {
        vector_type bias_gradients(layer.outputCount(), 0.0f);

        for (std::size_t i = 0; i < layer.outputCount(); ++i)
            bias_gradients[i] = gradients[i] * layer.m_activationFunction[values[i]];

        return bias_gradients;
    }